

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasNext(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *this)

{
  BacktrackData ***pppBVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  
  if (this->_normalizationRecording == true) {
    pppBVar1 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + -1;
    this->_normalizationRecording = false;
    Lib::BacktrackData::backtrack(&this->_normalizationBacktrackData);
  }
  do {
    if ((this->_leafData).super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>._isSome
        == true) {
      cVar2 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar2 != '\0') break;
    }
    bVar3 = findNextLeaf(this);
  } while (bVar3);
  if ((this->_leafData).super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>._isSome
      == true) {
    uVar4 = (**(code **)(*(long *)(this->_leafData).
                                  super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>
                                  ._elem._elem + 0x10))();
    return (bool)uVar4;
  }
  return false;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }